

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O2

void ucnv_extContinueMatchToU_63
               (UConverter *cnv,UConverterToUnicodeArgs *pArgs,int32_t srcIndex,
               UErrorCode *pErrorCode)

{
  char *pre;
  uint8_t uVar1;
  char cVar2;
  UConverterSharedData *pUVar3;
  uint uVar4;
  long lVar5;
  undefined4 in_register_00000014;
  int32_t *cx;
  int iVar6;
  int8_t iVar7;
  char *s;
  char *src;
  UBool in_stack_ffffffffffffffa8;
  uint32_t value;
  UErrorCode *local_48;
  int32_t *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,srcIndex);
  value = 0;
  pUVar3 = cnv->sharedData;
  local_40 = (pUVar3->mbcs).extIndexes;
  uVar1 = (pUVar3->mbcs).outputType;
  if (uVar1 == '\f') {
    iVar7 = (int8_t)cnv->mode;
  }
  else {
    iVar7 = (uVar1 == 0xdb) * '\x02' + -1;
  }
  pre = cnv->preToU;
  iVar6 = (int)cnv->preToULength;
  src = pArgs->source;
  local_48 = pErrorCode;
  uVar4 = ucnv_extMatchToU(local_40,iVar7,pre,iVar6,src,*(int *)&pArgs->sourceLimit - (int)src,
                           &value,pArgs->flush,in_stack_ffffffffffffffa8);
  if ((int)uVar4 < 1) {
    if ((int)uVar4 < 0) {
      for (lVar5 = (long)iVar6; lVar5 < (long)(ulong)-uVar4; lVar5 = lVar5 + 1) {
        cVar2 = *src;
        src = src + 1;
        pre[lVar5] = cVar2;
      }
      pArgs->source = src;
      cnv->preToULength = (int8_t)-uVar4;
    }
    else {
      memcpy(cnv->toUBytes,pre,(long)cnv->preToUFirstLength);
      iVar6 = (int)cnv->preToUFirstLength;
      cnv->toULength = cnv->preToUFirstLength;
      uVar4 = cnv->preToULength - iVar6;
      if (uVar4 != 0 && iVar6 <= cnv->preToULength) {
        memmove(pre,pre + iVar6,(ulong)uVar4);
      }
      cnv->preToULength = -(char)uVar4;
      *local_48 = U_INVALID_CHAR_FOUND;
    }
  }
  else {
    if ((int)uVar4 < iVar6) {
      memmove(pre,pre + uVar4,(long)(int)(iVar6 - uVar4));
      iVar7 = -(char)(iVar6 - uVar4);
      cx = (pUVar3->mbcs).extIndexes;
    }
    else {
      pArgs->source = src + (int)(uVar4 - iVar6);
      iVar7 = '\0';
      cx = local_40;
    }
    cnv->preToULength = iVar7;
    ucnv_extWriteToU(cnv,cx,value,&pArgs->target,pArgs->targetLimit,&pArgs->offsets,
                     (int32_t)local_38,local_48);
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_extContinueMatchToU(UConverter *cnv,
                         UConverterToUnicodeArgs *pArgs, int32_t srcIndex,
                         UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match, length;

    match=ucnv_extMatchToU(cnv->sharedData->mbcs.extIndexes, (int8_t)UCNV_SISO_STATE(cnv),
                           cnv->preToU, cnv->preToULength,
                           pArgs->source, (int32_t)(pArgs->sourceLimit-pArgs->source),
                           &value,
                           cnv->useFallback, pArgs->flush);
    if(match>0) {
        if(match>=cnv->preToULength) {
            /* advance src pointer for the consumed input */
            pArgs->source+=match-cnv->preToULength;
            cnv->preToULength=0;
        } else {
            /* the match did not use all of preToU[] - keep the rest for replay */
            length=cnv->preToULength-match;
            uprv_memmove(cnv->preToU, cnv->preToU+match, length);
            cnv->preToULength=(int8_t)-length;
        }

        /* write result */
        ucnv_extWriteToU(cnv, cnv->sharedData->mbcs.extIndexes,
                         value,
                         &pArgs->target, pArgs->targetLimit,
                         &pArgs->offsets, srcIndex,
                         pErrorCode);
    } else if(match<0) {
        /* save state for partial match */
        const char *s;
        int32_t j;

        /* just _append_ the newly consumed input to preToU[] */
        s=pArgs->source;
        match=-match;
        for(j=cnv->preToULength; j<match; ++j) {
            cnv->preToU[j]=*s++;
        }
        pArgs->source=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preToULength=(int8_t)match;
    } else /* match==0 */ {
        /*
         * no match
         *
         * We need to split the previous input into two parts:
         *
         * 1. The first codepage character is unmappable - that's how we got into
         *    trying the extension data in the first place.
         *    We need to move it from the preToU buffer
         *    to the error buffer, set an error code,
         *    and prepare the rest of the previous input for 2.
         *
         * 2. The rest of the previous input must be converted once we
         *    come back from the callback for the first character.
         *    At that time, we have to try again from scratch to convert
         *    these input characters.
         *    The replay will be handled by the ucnv.c conversion code.
         */

        /* move the first codepage character to the error field */
        uprv_memcpy(cnv->toUBytes, cnv->preToU, cnv->preToUFirstLength);
        cnv->toULength=cnv->preToUFirstLength;

        /* move the rest up inside the buffer */
        length=cnv->preToULength-cnv->preToUFirstLength;
        if(length>0) {
            uprv_memmove(cnv->preToU, cnv->preToU+cnv->preToUFirstLength, length);
        }

        /* mark preToU for replay */
        cnv->preToULength=(int8_t)-length;

        /* set the error code for unassigned */
        *pErrorCode=U_INVALID_CHAR_FOUND;
    }
}